

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsFunctionInfo
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  Type *addr;
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ushort uVar4;
  bool bVar5;
  BOOL BVar6;
  AsmJsFunctionInfo *pAVar7;
  byte *pbVar8;
  Recycler *pRVar9;
  undefined4 *puVar10;
  uint *puVar11;
  Which *pWVar12;
  TypedSlotInfo *pTVar13;
  TypedSlotInfo *info;
  ulong uVar14;
  Type *addr_00;
  byte *pbVar15;
  int i;
  Types type;
  undefined1 local_78 [8];
  bool boolVal;
  ulong local_68;
  char *local_60;
  DWORD local_58;
  Which local_4c;
  AsmJsRetType local_48;
  int retVal;
  AsmJsFunctionInfo *pAStack_40;
  ArgSlot argByteSize;
  ushort local_34;
  Type local_32 [3];
  ArgSlot argSizeArrayLength;
  ArgSlot argCount;
  
  pAVar7 = FunctionBody::AllocateAsmJsFunctionInfo(function);
  pbVar8 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                     (int *)&local_4c);
  AsmJsRetType::AsmJsRetType(&local_48,local_4c);
  (pAVar7->mReturnType).which_ = local_48.which_;
  pbVar8 = ReadInt16(pbVar8,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar8)),
                     (int16 *)local_32);
  pAVar7->mArgCount = local_32[0];
  pbVar8 = ReadInt16(pbVar8,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar8)),
                     (int16 *)((long)&retVal + 2));
  pAVar7->mArgByteSize = retVal._2_2_;
  pbVar8 = ReadInt16(pbVar8,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar8)),
                     (int16 *)&local_34);
  local_68 = (ulong)local_34;
  pAVar7->mArgSizesLength = local_34;
  local_78 = (undefined1  [8])&unsigned_int::typeinfo;
  _boolVal = 0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
  ;
  local_58 = 0xef2;
  pAStack_40 = pAVar7;
  pRVar9 = Memory::Recycler::TrackAllocInfo
                     (this->scriptContext->recycler,(TrackAllocData *)local_78);
  uVar4 = local_34;
  if (local_34 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar9,(TrackAllocData *)0x0);
    puVar11 = (uint *)&DAT_00000008;
  }
  else {
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_008845e2;
      *puVar10 = 0;
    }
    puVar11 = (uint *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                (pRVar9,(ulong)uVar4 << 2);
    if (puVar11 == (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) goto LAB_008845e2;
      *puVar10 = 0;
      puVar11 = (uint *)0x0;
    }
  }
  pAVar7 = pAStack_40;
  addr = &pAStack_40->mArgSizes;
  Memory::Recycler::WBSetBit((char *)addr);
  (pAVar7->mArgSizes).ptr = puVar11;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if (local_34 != 0) {
    uVar14 = 0;
    do {
      pbVar8 = ReadConstantSizedInt32
                         (pbVar8,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar8)),
                          (int *)local_78);
      puVar11[uVar14] = local_78._0_4_;
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_34);
  }
  if ((ulong)local_32[0] != 0) {
    local_78 = (undefined1  [8])&AsmJsVarType::Which::typeinfo;
    _boolVal = 0;
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
    ;
    local_58 = 0xefd;
    local_68 = (ulong)local_32[0];
    pRVar9 = Memory::Recycler::TrackAllocInfo
                       (this->scriptContext->recycler,(TrackAllocData *)local_78);
    uVar14 = (ulong)local_32[0];
    if (uVar14 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar9,(TrackAllocData *)0x0);
      pWVar12 = &DAT_00000008;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_008845e2;
        *puVar10 = 0;
      }
      pWVar12 = (Which *)Memory::Recycler::
                         AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(pRVar9,uVar14)
      ;
      if (pWVar12 == (Which *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) {
LAB_008845e2:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar10 = 0;
        pWVar12 = (Which *)0x0;
      }
    }
    pAVar7 = pAStack_40;
    addr_00 = &pAStack_40->mArgType;
    Memory::Recycler::WBSetBit((char *)addr_00);
    (pAVar7->mArgType).ptr = pWVar12;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    if (local_32[0] != 0) {
      uVar14 = 0;
      do {
        pbVar8 = ReadByte(pbVar8,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar8)),
                          pWVar12 + uVar14);
        uVar14 = uVar14 + 1;
      } while (uVar14 < local_32[0]);
    }
  }
  pbVar8 = ReadBool(this,pbVar8,(bool *)local_78);
  pAVar7 = pAStack_40;
  pAStack_40->mUsesHeapBuffer = local_78[0];
  type = SIMD;
  do {
    pbVar15 = pbVar8 + 0x14;
    pTVar13 = AsmJsFunctionInfo::GetTypedSlotInfo(pAVar7,type);
    uVar2 = *(undefined8 *)pbVar8;
    uVar3 = *(undefined8 *)(pbVar8 + 8);
    pTVar13->constCount = (int)uVar2;
    pTVar13->varCount = (int)((ulong)uVar2 >> 0x20);
    pTVar13->tmpCount = (int)uVar3;
    pTVar13->byteOffset = (int)((ulong)uVar3 >> 0x20);
    pTVar13->constSrcByteOffset = *(Type *)(pbVar8 + 0x10);
    bVar5 = type != INT32;
    type = type - INT64;
    pbVar8 = pbVar15;
  } while (bVar5);
  return pbVar15;
}

Assistant:

const byte * ReadAsmJsFunctionInfo(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfAsmJsFuncInfo);
#endif

        AsmJsFunctionInfo* funcInfo = function->AllocateAsmJsFunctionInfo();

        int retVal;
        current = ReadInt32(current, &retVal);
        funcInfo->SetReturnType(AsmJsRetType((AsmJsRetType::Which)retVal));

        ArgSlot argCount;
        current = ReadUInt16(current, &argCount);
        funcInfo->SetArgCount(argCount);

        ArgSlot argByteSize;
        current = ReadUInt16(current, &argByteSize);
        funcInfo->SetArgByteSize(argByteSize);

        ArgSlot argSizeArrayLength;
        current = ReadUInt16(current, &argSizeArrayLength);
        funcInfo->SetArgSizeArrayLength(argSizeArrayLength);
        uint* argArray = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), uint, argSizeArrayLength);
        funcInfo->SetArgsSizesArray(argArray);
        for (int i = 0; i < argSizeArrayLength; i++)
        {
            int32 size;
            current = ReadConstantSizedInt32(current, &size);
            argArray[i] = (uint32)size;
        }

        if (argCount > 0)
        {
            AsmJsVarType::Which * typeArray = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), AsmJsVarType::Which, argCount);
            funcInfo->SetArgTypeArray(typeArray);
            for (uint i = 0; i < argCount; i++)
            {
                current = ReadByte(current, (byte*)&typeArray[i]);
            }
        }

        bool boolVal;
        current = ReadBool(current, &boolVal);
        funcInfo->SetUsesHeapBuffer(boolVal);

        for (int i = WAsmJs::LIMIT - 1; i >= 0; --i)
        {
            serialization_alignment WAsmJs::TypedSlotInfo* info;
            current = ReadStruct<WAsmJs::TypedSlotInfo>(current, &info);
            WAsmJs::TypedSlotInfo* typedInfo = funcInfo->GetTypedSlotInfo((WAsmJs::Types)i);
            *typedInfo = *info;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfAsmJsFuncInfo);
#endif

        return current;
    }